

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

char * libssh2_session_hostkey(LIBSSH2_SESSION *session,size_t *len,int *type)

{
  int iVar1;
  int *type_local;
  size_t *len_local;
  LIBSSH2_SESSION *session_local;
  
  if (session->server_hostkey_len == 0) {
    if (len != (size_t *)0x0) {
      *len = 0;
    }
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  else {
    if (len != (size_t *)0x0) {
      *len = (ulong)session->server_hostkey_len;
    }
    if (type != (int *)0x0) {
      iVar1 = hostkey_type(session->server_hostkey,(ulong)session->server_hostkey_len);
      *type = iVar1;
    }
    session_local = (LIBSSH2_SESSION *)session->server_hostkey;
  }
  return (char *)session_local;
}

Assistant:

LIBSSH2_API const char *
libssh2_session_hostkey(LIBSSH2_SESSION *session, size_t *len, int *type)
{
    if(session->server_hostkey_len) {
        if(len)
            *len = session->server_hostkey_len;
        if (type)
            *type = hostkey_type(session->server_hostkey,
                                 session->server_hostkey_len);
        return (char *) session->server_hostkey;
    }
    if(len)
        *len = 0;
    return NULL;
}